

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableView::dropEvent(QTableView *this,QDropEvent *event)

{
  QPersistentModelIndex *pQVar1;
  long *plVar2;
  long *plVar3;
  int *piVar4;
  char cVar5;
  DragDropMode DVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  QTableView *pQVar10;
  iterator __first;
  iterator __last;
  QAbstractItemModel *pQVar11;
  QModelIndex *index;
  int *piVar12;
  QPersistentModelIndex *pQVar13;
  long lVar14;
  long lVar15;
  long in_FS_OFFSET;
  bool bVar16;
  QPersistentModelIndex firstColIndex;
  QPersistentModelIndex dropRow;
  int row;
  int col;
  QPersistentModelIndex local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  QPersistentModelIndex local_c0;
  QModelIndex local_b8;
  QArrayDataPointer<QPersistentModelIndex> local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  int local_58;
  int local_54;
  long local_50 [4];
  
  local_50[3] = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.field_0x8;
  pQVar10 = (QTableView *)QDropEvent::source();
  if ((pQVar10 == this) &&
     ((*(int *)(event + 0x2c) == 2 ||
      (DVar6 = QAbstractItemView::dragDropMode((QAbstractItemView *)this), DVar6 == InternalMove))))
  {
    local_50[0] = -1;
    local_50[1] = 0;
    local_50[2] = 0;
    local_54 = -1;
    local_58 = -1;
    if ((event[0xc] == (QDropEvent)0x0) &&
       (cVar5 = (**(code **)(*plVar2 + 0x110))(plVar2,event,&local_58,&local_54,local_50),
       cVar5 != '\0')) {
      bVar16 = false;
      if ((-1 < (int)local_50[0]) && (bVar16 = false, -1 < local_50[0])) {
        bVar16 = local_50[2] != 0;
      }
      if ((!bVar16) && (local_54 != -1)) {
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = 0xaaaaaaaa;
        uStack_74 = 0xaaaaaaaa;
        uStack_70 = 0xaaaaaaaa;
        uStack_6c = 0xaaaaaaaa;
        (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                               super_QFrame.super_QWidget + 0x2d8))(&local_78,this);
        local_98.d = (Data *)0x0;
        local_98.ptr = (QPersistentModelIndex *)0x0;
        local_98.size = 0;
        QList<QPersistentModelIndex>::reserve
                  ((QList<QPersistentModelIndex> *)&local_98,(qsizetype)local_68);
        if (local_68 != (undefined1 *)0x0) {
          piVar12 = (int *)CONCAT44(uStack_6c,uStack_70);
          piVar4 = piVar12 + (long)local_68 * 6;
          do {
            local_d8.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
            plVar3 = *(long **)(piVar12 + 4);
            if (plVar3 == (long *)0x0) {
              local_b8.r = -1;
              local_b8.c = -1;
              local_b8.i = 0;
              local_b8.m.ptr = (QAbstractItemModel *)0x0;
            }
            else if (piVar12[1] == 0) {
              local_b8.m.ptr = *(QAbstractItemModel **)(piVar12 + 4);
              local_b8.r = piVar12[0];
              local_b8.c = piVar12[1];
              local_b8.i = *(quintptr *)(piVar12 + 2);
            }
            else {
              (**(code **)(*plVar3 + 0x70))(&local_b8,plVar3,*piVar12,0,piVar12);
            }
            QPersistentModelIndex::QPersistentModelIndex(&local_d8,&local_b8);
            pQVar1 = local_98.ptr;
            if (local_98.size == 0) {
LAB_0058bb42:
              QtPrivate::QMovableArrayOps<QPersistentModelIndex>::
              emplace<QPersistentModelIndex_const&>
                        ((QMovableArrayOps<QPersistentModelIndex> *)&local_98,local_98.size,
                         &local_d8);
              QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_98);
            }
            else {
              lVar15 = local_98.size << 3;
              lVar14 = 0;
              do {
                if (lVar15 == lVar14) goto LAB_0058bb42;
                cVar5 = comparesEqual((QPersistentModelIndex *)((long)&pQVar1->d + lVar14),&local_d8
                                     );
                lVar14 = lVar14 + 8;
              } while (cVar5 == '\0');
              if ((long)local_98.ptr - (long)pQVar1 == lVar14) goto LAB_0058bb42;
            }
            iVar8 = *piVar12;
            iVar7 = (int)local_50[0];
            QPersistentModelIndex::~QPersistentModelIndex(&local_d8);
            if (iVar8 == iVar7) goto LAB_0058bd3e;
            piVar12 = piVar12 + 6;
          } while (piVar12 != piVar4);
        }
        __first = QList<QPersistentModelIndex>::begin((QList<QPersistentModelIndex> *)&local_98);
        __last = QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_98);
        std::sort<QList<QPersistentModelIndex>::iterator>(__first,__last);
        local_c0.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar11 = QAbstractItemView::model((QAbstractItemView *)this);
        (**(code **)(*(long *)pQVar11 + 0x60))(&local_b8,pQVar11,local_58,local_54,local_50);
        QPersistentModelIndex::QPersistentModelIndex(&local_c0,&local_b8);
        if (local_58 == -1) {
          pQVar11 = QAbstractItemView::model((QAbstractItemView *)this);
          local_b8.r = -1;
          local_b8.c = -1;
          local_b8.i = 0;
          local_b8.m.ptr = (QAbstractItemModel *)0x0;
          iVar8 = (**(code **)(*(long *)pQVar11 + 0x78))(pQVar11);
        }
        else {
          iVar7 = QPersistentModelIndex::row();
          iVar8 = local_58;
          if (-1 < iVar7) {
            iVar8 = QPersistentModelIndex::row();
          }
        }
        if (local_98.size != 0) {
          pQVar1 = local_98.ptr + local_98.size;
          bVar16 = false;
          pQVar13 = local_98.ptr;
LAB_0058bc80:
          do {
            iVar7 = QPersistentModelIndex::row();
            if ((iVar8 != iVar7) && (iVar7 = QPersistentModelIndex::row(), iVar8 != iVar7 + 1)) {
              pQVar11 = QAbstractItemView::model((QAbstractItemView *)this);
              local_b8.r = -1;
              local_b8.c = -1;
              local_b8.i = 0;
              local_b8.m.ptr = (QAbstractItemModel *)0x0;
              uVar9 = QPersistentModelIndex::row();
              local_d8.d = (QPersistentModelIndexData *)0xffffffffffffffff;
              local_d0 = 0;
              uStack_c8 = 0;
              cVar5 = (**(code **)(*(long *)pQVar11 + 0x118))
                                (pQVar11,&local_b8,uVar9,1,&local_d8,iVar8);
              if (cVar5 == '\0') {
                pQVar13 = pQVar13 + 1;
                if (pQVar13 == pQVar1) {
                  if (!bVar16) goto LAB_0058bd34;
                  break;
                }
                goto LAB_0058bc80;
              }
            }
            iVar8 = QPersistentModelIndex::row();
            iVar8 = iVar8 + 1;
            pQVar13 = pQVar13 + 1;
            bVar16 = true;
          } while (pQVar13 != pQVar1);
          *(undefined1 *)((long)plVar2 + 0x3e5) = 1;
          event[0xc] = (QDropEvent)0x1;
        }
LAB_0058bd34:
        QPersistentModelIndex::~QPersistentModelIndex(&local_c0);
LAB_0058bd3e:
        QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_98);
        piVar4 = (int *)CONCAT44(uStack_74,local_78);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),0x18,0x10);
          }
        }
      }
    }
  }
  if (event[0xc] == (QDropEvent)0x0) {
    QAbstractItemView::dropEvent((QAbstractItemView *)this,event);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_50[3]) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::dropEvent(QDropEvent *event)
{
    Q_D(QTableView);
    if (event->source() == this && (event->dropAction() == Qt::MoveAction ||
                                    dragDropMode() == QAbstractItemView::InternalMove)) {
        QModelIndex topIndex;
        int col = -1;
        int row = -1;
        // check whether a subclass has already accepted the event, ie. moved the data
        if (!event->isAccepted() && d->dropOn(event, &row, &col, &topIndex) && !topIndex.isValid() && col != -1) {
            // Drop between items (reordering) - can only happen with setDragDropOverwriteMode(false)
            const QModelIndexList indexes = selectedIndexes();
            QList<QPersistentModelIndex> persIndexes;
            persIndexes.reserve(indexes.size());

            bool topIndexDropped = false;
            for (const auto &index : indexes) {
                // Reorder entire rows
                QPersistentModelIndex firstColIndex = index.siblingAtColumn(0);
                if (!persIndexes.contains(firstColIndex))
                    persIndexes.append(firstColIndex);
                if (index.row() == topIndex.row()) {
                    topIndexDropped = true;
                    break;
                }
            }
            if (!topIndexDropped) {
                std::sort(persIndexes.begin(), persIndexes.end()); // The dropped items will remain in the same visual order.

                QPersistentModelIndex dropRow = model()->index(row, col, topIndex);

                int r = row == -1 ? model()->rowCount() : (dropRow.row() >= 0 ? dropRow.row() : row);
                bool dataMoved = false;
                for (const QPersistentModelIndex &pIndex : std::as_const(persIndexes)) {
                    // only generate a move when not same row or behind itself
                    if (r != pIndex.row() && r != pIndex.row() + 1) {
                        // try to move (preserves selection)
                        const bool moved = model()->moveRow(QModelIndex(), pIndex.row(), QModelIndex(), r);
                        if (!moved)
                            continue; // maybe it'll work for other rows
                        dataMoved = true; // success
                    } else {
                        // move onto itself is blocked, don't delete anything
                        dataMoved = true;
                    }
                    r = pIndex.row() + 1;   // Dropped items are inserted contiguously and in the right order.
                }
                if (dataMoved) {
                    d->dropEventMoved = true;
                    event->accept();
                }
            }
        }
    }

    if (!event->isAccepted()) {
        // moveRows not implemented, fall back to default
        QAbstractItemView::dropEvent(event);
    }
}